

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O2

bool Js::LineOffsetCache::FindNextLine
               (LPCUTF8 *currentSourcePosition,LPCUTF8 sourceEndCharacter,
               charcount_t *inOutCharacterOffset,charcount_t *inOutByteOffset,
               charcount_t maxCharacterOffset)

{
  bool bVar1;
  char16 cVar2;
  charcount_t cVar3;
  LPCUTF8 puVar4;
  charcount_t cVar5;
  DecodeOptions local_38;
  charcount_t local_34;
  DecodeOptions options;
  
  cVar5 = *inOutCharacterOffset;
  cVar3 = *inOutByteOffset;
  local_38 = doAllowThreeByteSurrogates;
  puVar4 = *currentSourcePosition;
  local_34 = maxCharacterOffset;
  while( true ) {
    if (sourceEndCharacter <= puVar4) {
      return false;
    }
    bVar1 = false;
    cVar2 = utf8::Decode(currentSourcePosition,sourceEndCharacter,&local_38,(bool *)0x0);
    if (((ushort)cVar2 - 0x2028 < 2) || (cVar2 == L'\n')) {
      bVar1 = true;
    }
    else if (cVar2 == L'\r') {
      bVar1 = true;
      if (**currentSourcePosition == '\n') {
        *currentSourcePosition = *currentSourcePosition + 1;
        cVar5 = cVar5 + 1;
      }
    }
    cVar5 = cVar5 + 1;
    cVar3 = cVar3 + ((int)*currentSourcePosition - (int)puVar4);
    if (bVar1) break;
    puVar4 = *currentSourcePosition;
    if (local_34 <= cVar5) {
      return false;
    }
  }
  *inOutCharacterOffset = cVar5;
  *inOutByteOffset = cVar3;
  return true;
}

Assistant:

bool LineOffsetCache::FindNextLine(_In_z_ LPCUTF8 &currentSourcePosition, _In_z_ LPCUTF8 sourceEndCharacter, charcount_t &inOutCharacterOffset, charcount_t &inOutByteOffset, charcount_t maxCharacterOffset)
    {
        charcount_t currentCharacterOffset = inOutCharacterOffset;
        charcount_t currentByteOffset = inOutByteOffset;
        utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

        while (currentSourcePosition < sourceEndCharacter)
        {
            LPCUTF8 previousCharacter = currentSourcePosition;

            // Decode from UTF8 to wide char.  Note that Decode will advance the current character by 1 at least.
            char16 decodedCharacter = utf8::Decode(currentSourcePosition, sourceEndCharacter, options);

            bool wasLineEncountered = false;
            switch (decodedCharacter)
            {
            case _u('\r'):
                // Check if the next character is a '\n'.  If so, consume that character as well
                // (consider as one line).
                if (*currentSourcePosition == '\n')
                {
                    ++currentSourcePosition;
                    ++currentCharacterOffset;
                }

                // Intentional fall-through.
            case _u('\n'):
            case 0x2028:
            case 0x2029:
                // Found a new line.
                wasLineEncountered = true;
                break;
            }

            // Move to the next character offset.
            ++currentCharacterOffset;

            // Count the current byte offset we're at in the UTF-8 buffer.
            // The character size can be > 1 for unicode characters.
            currentByteOffset += static_cast<int>(currentSourcePosition - previousCharacter);

            if (wasLineEncountered)
            {
                inOutCharacterOffset = currentCharacterOffset;
                inOutByteOffset = currentByteOffset;
                return true;
            }
            else if (currentCharacterOffset >= maxCharacterOffset)
            {
                return false;
            }
        }

        return false;
    }